

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::BasicReporter::EndGroup(BasicReporter *this,string *groupName,Totals *totals)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  string local_48;
  bool local_28;
  
  if (((this->m_groupSpan).emitted == true) && (groupName->_M_string_length != 0)) {
    poVar2 = (this->m_config).m_stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"[End of group: \'",0x10);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(groupName->_M_dataplus)._M_p,groupName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'. ",3);
    paVar1 = &local_48.field_2;
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"All ","");
    ReportCounts(this,totals,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    poVar2 = (this->m_config).m_stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]\n",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    local_48._M_string_length = 0;
    local_48.field_2._M_local_buf[0] = '\0';
    local_28 = false;
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_assign((string *)&this->m_groupSpan);
    (this->m_groupSpan).emitted = local_28;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

virtual void EndGroup( const std::string& groupName, const Totals& totals ) {
            if( m_groupSpan.emitted && !groupName.empty() ) {
                m_config.stream() << "[End of group: '" << groupName << "'. ";
                ReportCounts( totals );
                m_config.stream() << "]\n" << std::endl;
                m_groupSpan = SpanInfo();
            }
        }